

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<draco::EncodedGeometryType> *
draco::Decoder::GetEncodedGeometryType(DecoderBuffer *in_buffer)

{
  bool bVar1;
  undefined8 *in_RSI;
  StatusOr<draco::EncodedGeometryType> *in_RDI;
  DracoHeader *in_stack_00000080;
  Status _local_status;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  undefined4 in_stack_fffffffffffffef8;
  Code in_stack_fffffffffffffefc;
  StatusOr<draco::EncodedGeometryType> *in_stack_ffffffffffffff00;
  StatusOr<draco::EncodedGeometryType> *this;
  allocator<char> local_d9;
  string local_d8 [8];
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Status local_80;
  byte local_4d;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_18 = in_RSI[6];
  local_48 = *in_RSI;
  uStack_40 = in_RSI[1];
  local_38 = in_RSI[2];
  uStack_30 = in_RSI[3];
  local_28 = in_RSI[4];
  uStack_20 = in_RSI[5];
  PointCloudDecoder::DecodeHeader((DecoderBuffer *)_local_status._0_8_,in_stack_00000080);
  bVar1 = Status::ok(&local_80);
  if (!bVar1) {
    StatusOr<draco::EncodedGeometryType>::StatusOr
              (in_stack_ffffffffffffff00,
               (Status *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  Status::~Status((Status *)0x152f63);
  if (bVar1) {
    if (local_4d < 2) {
      StatusOr<draco::EncodedGeometryType>::StatusOr
                (in_stack_ffffffffffffff00,
                 (EncodedGeometryType *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    else {
      this = (StatusOr<draco::EncodedGeometryType> *)&local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Status::Status(&this->status_,in_stack_fffffffffffffefc,(string *)0x152fbd);
      StatusOr<draco::EncodedGeometryType>::StatusOr
                (this,(Status *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      Status::~Status((Status *)0x152fda);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
  }
  DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x153081);
  return in_RDI;
}

Assistant:

StatusOr<EncodedGeometryType> Decoder::GetEncodedGeometryType(
    DecoderBuffer *in_buffer) {
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header));
  if (header.encoder_type >= NUM_ENCODED_GEOMETRY_TYPES) {
    return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
  }
  return static_cast<EncodedGeometryType>(header.encoder_type);
}